

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.h
# Opt level: O1

void __thiscall obs::signal<void_()>::operator()<>(signal<void_()> *this)

{
  bool bVar1;
  iterator __begin0;
  iterator __end0;
  iterator local_60;
  iterator local_38;
  
  safe_list<obs::slot<void_()>_>::begin(&local_60,&this->m_slots);
  safe_list<obs::slot<void_()>_>::end(&local_38,&this->m_slots);
  while( true ) {
    bVar1 = safe_list<obs::slot<void_()>_>::iterator::operator!=(&local_60,&local_38);
    if (!bVar1) {
      safe_list<obs::slot<void_()>_>::iterator::~iterator(&local_38);
      safe_list<obs::slot<void_()>_>::iterator::~iterator(&local_60);
      return;
    }
    if ((local_60.m_node == (node *)0x0) || (local_60.m_locked == false)) break;
    if (local_60.m_value != (slot<void_()> *)0x0) {
      if (((local_60.m_value)->f).super__Function_base._M_manager == (_Manager_type)0x0) {
        __assert_fail("f",
                      "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/./obs/slot.h"
                      ,0x4d,
                      "void obs::slot<void ()>::operator()(Args2 &&...) [Callable = void (), Args2 = <>]"
                     );
      }
      (*((local_60.m_value)->f)._M_invoker)((_Any_data *)&(local_60.m_value)->f);
    }
    safe_list<obs::slot<void_()>_>::iterator::operator++(&local_60);
  }
  __assert_fail("m_node && m_locked",
                "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/./obs/safe_list.h"
                ,0xd8,
                "T *obs::safe_list<obs::slot<void ()>>::iterator::operator*() const [T = obs::slot<void ()>]"
               );
}

Assistant:

void operator()(Args2&&...args) {
    for (auto slot : m_slots)
      if (slot)
        (*slot)(std::forward<Args2>(args)...);
  }